

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf.c
# Opt level: O0

void duckdb_shell_sqlite3StrAccumInit(StrAccum *p,void *db,char *zBase,int n,int mx)

{
  int mx_local;
  int n_local;
  char *zBase_local;
  void *db_local;
  StrAccum *p_local;
  
  p->zText = zBase;
  p->db = db;
  p->nAlloc = n;
  p->mxAlloc = mx;
  p->nChar = 0;
  p->accError = '\0';
  p->printfFlags = '\0';
  return;
}

Assistant:

void sqlite3StrAccumInit(StrAccum *p, void *db, char *zBase, int n, int mx) {
	p->zText = zBase;
	assert(!db);
	p->db = db;
	p->nAlloc = n;
	p->mxAlloc = mx;
	p->nChar = 0;
	p->accError = 0;
	p->printfFlags = 0;
}